

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void applyNumericAffinity(Mem *pRec)

{
  u8 enc;
  ushort uVar1;
  char *z;
  ushort uVar2;
  int iVar3;
  int iVar4;
  i64 iValue;
  double rValue;
  anon_union_8_5_44880d43_for_u local_38;
  double local_30;
  
  uVar1 = pRec->flags;
  if (((uVar1 & 0xc) == 0) && ((uVar1 & 2) != 0)) {
    z = pRec->z;
    iVar4 = pRec->n;
    enc = pRec->enc;
    iVar3 = sqlite3AtoF(z,&local_30,iVar4,enc);
    if (iVar3 != 0) {
      iVar4 = sqlite3Atoi64(z,&local_38.i,iVar4,enc);
      if (iVar4 == 0) {
        pRec->u = local_38;
        uVar2 = 4;
      }
      else {
        pRec->r = local_30;
        uVar2 = 8;
      }
      pRec->flags = uVar2 | uVar1;
    }
  }
  return;
}

Assistant:

static void applyNumericAffinity(Mem *pRec){
  if( (pRec->flags & (MEM_Real|MEM_Int))==0 ){
    double rValue;
    i64 iValue;
    u8 enc = pRec->enc;
    if( (pRec->flags&MEM_Str)==0 ) return;
    if( sqlite3AtoF(pRec->z, &rValue, pRec->n, enc)==0 ) return;
    if( 0==sqlite3Atoi64(pRec->z, &iValue, pRec->n, enc) ){
      pRec->u.i = iValue;
      pRec->flags |= MEM_Int;
    }else{
      pRec->r = rValue;
      pRec->flags |= MEM_Real;
    }
  }
}